

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodemb.c
# Opt level: O0

void encode_block_pass1(int plane,int block,int blk_row,int blk_col,BLOCK_SIZE plane_bsize,
                       TX_SIZE tx_size,void *arg)

{
  int in_ECX;
  int in_EDX;
  int in_ESI;
  int in_EDI;
  undefined4 in_R8D;
  long *in_stack_00000008;
  QUANT_PARAM quant_param;
  TxfmParam txfm_param;
  uint8_t *dst;
  tran_low_t *dqcoeff;
  macroblockd_plane *pd;
  macroblock_plane *p;
  MACROBLOCKD *xd;
  MACROBLOCK *x;
  AV1_COMMON *cm;
  AV1_COMP *cpi;
  encode_block_pass1_args *args;
  QUANT_PARAM *in_stack_ffffffffffffff38;
  undefined8 in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  undefined2 uVar1;
  TX_TYPE tx_type;
  TX_SIZE tx_size_00;
  AV1_COMMON *in_stack_ffffffffffffff60;
  QUANT_PARAM *in_stack_ffffffffffffff68;
  TxfmParam local_78;
  uint8_t *local_60;
  tran_low_t *local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  long local_30;
  long local_28;
  undefined1 local_11;
  int local_8;
  
  uVar1 = (undefined2)in_ECX;
  tx_type = (TX_TYPE)((uint)in_ECX >> 0x10);
  tx_size_00 = (TX_SIZE)((uint)in_ECX >> 0x18);
  local_11 = (undefined1)in_R8D;
  local_28 = *in_stack_00000008;
  local_30 = local_28 + 0x3bf80;
  local_38 = in_stack_00000008[1];
  local_40 = local_38 + 0x1a0;
  local_48 = local_38 + (long)in_EDI * 0x88;
  local_50 = local_38 + 0x1b0 + (long)in_EDI * 0xa30;
  local_58 = (tran_low_t *)(*(long *)(local_48 + 8) + (long)(in_ESI << 4) * 4);
  local_60 = (uint8_t *)
             (*(long *)(local_50 + 0x10) + (long)((in_EDX * *(int *)(local_50 + 0x28) + in_ECX) * 4)
             );
  local_8 = in_ESI;
  av1_setup_xform(in_stack_ffffffffffffff60,(MACROBLOCK *)CONCAT44(in_ESI,in_EDX),tx_size_00,tx_type
                  ,(TxfmParam *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  av1_setup_quant((TX_SIZE)((ulong)in_stack_ffffffffffffff40 >> 0x38),(int)in_stack_ffffffffffffff40
                  ,(int)((ulong)in_stack_ffffffffffffff38 >> 0x20),(int)in_stack_ffffffffffffff38,
                  (QUANT_PARAM *)0x2268bf);
  av1_setup_qmatrix((CommonQuantParams *)
                    CONCAT17(tx_size_00,CONCAT16(tx_type,CONCAT24(uVar1,in_R8D))),
                    (MACROBLOCKD *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                    (int)((ulong)in_stack_ffffffffffffff40 >> 0x20),
                    (TX_SIZE)((ulong)in_stack_ffffffffffffff40 >> 0x18),
                    (TX_TYPE)((ulong)in_stack_ffffffffffffff40 >> 0x10),in_stack_ffffffffffffff38);
  av1_xform_quant((MACROBLOCK *)CONCAT17(tx_size_00,CONCAT16(tx_type,CONCAT24(uVar1,in_R8D))),
                  in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48,
                  (int)((ulong)&stack0xffffffffffffff60 >> 0x20),(int)&stack0xffffffffffffff60,
                  (BLOCK_SIZE)((ulong)&local_78 >> 0x38),(TxfmParam *)in_stack_ffffffffffffff60,
                  in_stack_ffffffffffffff68);
  if (*(short *)(*(long *)(local_48 + 0x20) + (long)local_8 * 2) != 0) {
    local_78.eob = (int)*(ushort *)(*(long *)(local_48 + 0x20) + (long)local_8 * 2);
    if (local_78.is_hbd == 0) {
      (*av1_inv_txfm_add)(local_58,local_60,*(int *)(local_50 + 0x28),&local_78);
    }
    else {
      (*av1_highbd_inv_txfm_add)(local_58,local_60,*(int *)(local_50 + 0x28),&local_78);
    }
  }
  return;
}

Assistant:

static void encode_block_pass1(int plane, int block, int blk_row, int blk_col,
                               BLOCK_SIZE plane_bsize, TX_SIZE tx_size,
                               void *arg) {
  encode_block_pass1_args *args = (encode_block_pass1_args *)arg;
  AV1_COMP *cpi = args->cpi;
  AV1_COMMON *cm = &cpi->common;
  MACROBLOCK *const x = args->x;
  MACROBLOCKD *const xd = &x->e_mbd;
  struct macroblock_plane *const p = &x->plane[plane];
  struct macroblockd_plane *const pd = &xd->plane[plane];
  tran_low_t *const dqcoeff = p->dqcoeff + BLOCK_OFFSET(block);

  uint8_t *dst;
  dst = &pd->dst.buf[(blk_row * pd->dst.stride + blk_col) << MI_SIZE_LOG2];

  TxfmParam txfm_param;
  QUANT_PARAM quant_param;

  av1_setup_xform(cm, x, tx_size, DCT_DCT, &txfm_param);
  av1_setup_quant(tx_size, 0, AV1_XFORM_QUANT_B, cpi->oxcf.q_cfg.quant_b_adapt,
                  &quant_param);
  av1_setup_qmatrix(&cm->quant_params, xd, plane, tx_size, DCT_DCT,
                    &quant_param);

  av1_xform_quant(x, plane, block, blk_row, blk_col, plane_bsize, &txfm_param,
                  &quant_param);

  if (p->eobs[block] > 0) {
    txfm_param.eob = p->eobs[block];
    if (txfm_param.is_hbd) {
      av1_highbd_inv_txfm_add(dqcoeff, dst, pd->dst.stride, &txfm_param);
      return;
    }
    av1_inv_txfm_add(dqcoeff, dst, pd->dst.stride, &txfm_param);
  }
}